

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RDLhandler.c
# Opt level: O1

double RDL_countPaths(uint a,uint b,uint V,RDL_sPathInfo *spi)

{
  uint *puVar1;
  double dVar2;
  uint uVar3;
  RDL_graph *pRVar4;
  uint *puVar5;
  RDL_edge *paRVar6;
  void *__s;
  uint *indegree;
  uint *__ptr;
  ulong uVar7;
  uint uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  
  uVar9 = (ulong)V;
  __s = malloc(uVar9 * 8);
  indegree = (uint *)malloc(uVar9 * 4);
  __ptr = (uint *)malloc(uVar9 * 4);
  if (V != 0) {
    memset(__s,0,uVar9 * 8);
    memset(indegree,0xff,uVar9 * 4);
  }
  RDL_findIndegree(a,b,indegree,spi);
  if (V != 0) {
    uVar7 = 0;
    uVar8 = 0;
    do {
      if (indegree[uVar7] == 0) {
        __ptr[uVar8] = (uint)uVar7;
        uVar8 = uVar8 + 1;
        *(undefined8 *)((long)__s + uVar7 * 8) = 0x3ff0000000000000;
      }
      uVar7 = uVar7 + 1;
    } while (uVar9 != uVar7);
    if ((uVar8 == 1) && (*__ptr == b)) {
      pRVar4 = spi->dPaths[a];
      puVar5 = pRVar4->degree;
      uVar9 = 1;
      do {
        uVar9 = (ulong)((int)uVar9 - 1);
        uVar7 = (ulong)__ptr[uVar9];
        uVar10 = (ulong)puVar5[uVar7];
        if (uVar10 != 0) {
          paRVar6 = pRVar4->adjList[uVar7];
          uVar11 = 0;
          do {
            uVar3 = paRVar6[uVar11][0];
            uVar12 = (ulong)uVar3;
            puVar1 = indegree + uVar12;
            *puVar1 = *puVar1 - 1;
            uVar8 = *puVar1;
            *(double *)((long)__s + uVar12 * 8) =
                 *(double *)((long)__s + uVar7 * 8) + *(double *)((long)__s + uVar12 * 8);
            if (uVar8 == 0) {
              __ptr[uVar9] = uVar3;
              uVar9 = (ulong)((int)uVar9 + 1);
            }
            uVar11 = uVar11 + 1;
          } while (uVar10 != uVar11);
        }
      } while ((int)uVar9 != 0);
      dVar2 = *(double *)((long)__s + (ulong)a * 8);
      free(__s);
      free(indegree);
      free(__ptr);
      return dVar2;
    }
  }
  (*RDL_outputFunc)(RDL_ERROR,"invalid topological sort!");
  __assert_fail("0",
                "/workspace/llm4binary/github/license_c_cmakelists/rareylab[P]RingDecomposerLib/src/RingDecomposerLib/RDLhandler.c"
                ,0x5c,
                "double RDL_countPaths(unsigned int, unsigned int, unsigned int, const RDL_sPathInfo *)"
               );
}

Assistant:

double RDL_countPaths(unsigned a, unsigned b,
    unsigned V, const RDL_sPathInfo *spi)
{
  unsigned i, curr, vertex, empty_end=0;
  unsigned *indegree, *empty_set;
  double *nof_paths, result;

  nof_paths = malloc(V * sizeof(*nof_paths));
  indegree = malloc(V * sizeof(*indegree));
  empty_set = malloc(V * sizeof(*empty_set));
  for (i = 0; i < V; ++i) {
    nof_paths[i] = 0.0;
    indegree[i] = UINT_MAX;
  }

  RDL_findIndegree(a, b, indegree, spi);

  for (i = 0; i < V; ++i) {
    if (indegree[i] == 0) {
      empty_set[empty_end] = i;
      ++empty_end;
      nof_paths[i] = 1.0;
    }
  }

  if (empty_end != 1 || empty_set[0] != b) {
    RDL_outputFunc(RDL_ERROR, "invalid topological sort!");
    /* should never happen */
    assert(0);
    free(nof_paths);
    free(indegree);
    free(empty_set);
    return DBL_MAX;
  }

  /* look at the nodes in an topological sort */
  while (empty_end) {
    curr = empty_set[empty_end-1];
    --empty_end;
    for(i=0; i<spi->dPaths[a]->degree[curr]; ++i) {
      vertex = spi->dPaths[a]->adjList[curr][i][0];
      --indegree[vertex];
      nof_paths[vertex] += nof_paths[curr];
      if (!indegree[vertex]) {
        empty_set[empty_end] = vertex;
        ++empty_end;
      }
    }
  }

  result = nof_paths[a];

  free(nof_paths);
  free(indegree);
  free(empty_set);

  return result;
}